

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::TypeManager::CreateDecoration
          (TypeManager *this,uint32_t target,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *decoration,bool is_member,
          uint32_t element)

{
  IRContext *pIVar1;
  TypeManager *pTVar2;
  pointer puVar3;
  Instruction *pIVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  ulong uVar6;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  undefined1 local_90 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_68;
  uint local_5c;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_58;
  TypeManager *local_38;
  
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._24_8_ = local_b8 + 0x10;
  local_b8._0_8_ = &PTR__SmallVector_003e9b28;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._8_8_ = 1;
  local_90._0_4_ = SPV_OPERAND_TYPE_ID;
  local_90._8_8_ = &PTR__SmallVector_003e9b28;
  local_90._16_8_ = 0;
  local_90._32_8_ = local_90 + 0x18;
  local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._16_4_ = target;
  local_38 = this;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_90 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_58,(Operand *)local_90);
  local_90._8_8_ = &PTR__SmallVector_003e9b28;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_68,local_68._M_head_impl);
  }
  local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  if (is_member) {
    local_b8._0_8_ = &PTR__SmallVector_003e9b28;
    local_b8._24_8_ = local_b8 + 0x10;
    local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_b8._8_8_ = 1;
    local_90._0_4_ = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_90._8_8_ = &PTR__SmallVector_003e9b28;
    local_90._16_8_ = 0;
    local_90._32_8_ = local_90 + 0x18;
    local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_b8._16_4_ = element;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_90 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_b8);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&local_58,(Operand *)local_90);
    local_90._8_8_ = &PTR__SmallVector_003e9b28;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_68,local_68._M_head_impl);
    }
    local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_b8._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_98,local_98._M_head_impl);
    }
  }
  local_b8._16_4_ =
       *(_Type *)(decoration->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_b8._0_8_ = &PTR__SmallVector_003e9b28;
  local_b8._24_8_ = local_b8 + 0x10;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._8_8_ = 1;
  local_90._0_4_ = SPV_OPERAND_TYPE_DECORATION;
  local_90._8_8_ = &PTR__SmallVector_003e9b28;
  local_90._16_8_ = 0;
  local_90._32_8_ = local_90 + 0x18;
  local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_90 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_58,(Operand *)local_90);
  local_90._8_8_ = &PTR__SmallVector_003e9b28;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_68,local_68._M_head_impl);
  }
  local_5c = (uint)CONCAT71(in_register_00000009,is_member);
  local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  puVar3 = (decoration->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (4 < (ulong)((long)(decoration->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
    uVar6 = 1;
    do {
      local_b8._16_4_ = *(_Type *)(puVar3 + uVar6);
      local_b8._0_8_ = &PTR__SmallVector_003e9b28;
      local_b8._24_8_ = local_b8 + 0x10;
      local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_b8._8_8_ = 1;
      local_90._0_4_ = SPV_OPERAND_TYPE_LITERAL_INTEGER;
      local_90._8_8_ = &PTR__SmallVector_003e9b28;
      local_90._16_8_ = 0;
      local_90._32_8_ = local_90 + 0x18;
      local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_90 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_b8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&local_58,(Operand *)local_90);
      local_90._8_8_ = &PTR__SmallVector_003e9b28;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_68,local_68._M_head_impl);
      }
      local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_b8._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_98,local_98._M_head_impl);
      }
      uVar6 = uVar6 + 1;
      puVar3 = (decoration->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
               .super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(decoration->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2));
  }
  pTVar2 = local_38;
  pIVar1 = local_38->context_;
  uVar5 = local_5c & 0xff;
  pIVar4 = (Instruction *)operator_new(0x70);
  Instruction::Instruction(pIVar4,pIVar1,uVar5 + OpDecorate,0,0,&local_58);
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) != kAnalysisNone) {
    DecorationManager::AddDecoration
              ((pIVar1->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl,pIVar4);
  }
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    DefUseManager::AnalyzeInstDefUse
              ((pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               pIVar4);
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((pIVar1->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->annotations_).
              super_IntrusiveList<spvtools::opt::Instruction>,pIVar4);
  pIVar1 = pTVar2->context_;
  pIVar4 = *(Instruction **)
            ((long)&(((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                    annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18);
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  DefUseManager::AnalyzeInstUse
            ((pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             pIVar4);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_58);
  return;
}

Assistant:

void TypeManager::CreateDecoration(uint32_t target,
                                   const std::vector<uint32_t>& decoration,
                                   bool is_member, uint32_t element) {
  std::vector<Operand> ops;
  ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {target}));
  if (is_member) {
    ops.push_back(Operand(SPV_OPERAND_TYPE_LITERAL_INTEGER, {element}));
  }
  ops.push_back(Operand(SPV_OPERAND_TYPE_DECORATION, {decoration[0]}));
  for (size_t i = 1; i < decoration.size(); ++i) {
    ops.push_back(Operand(SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration[i]}));
  }
  context()->AddAnnotationInst(MakeUnique<Instruction>(
      context(), (is_member ? spv::Op::OpMemberDecorate : spv::Op::OpDecorate),
      0, 0, ops));
  Instruction* inst = &*--context()->annotation_end();
  context()->get_def_use_mgr()->AnalyzeInstUse(inst);
}